

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::TestRegistry::sortTests
               (IConfig *config,
               vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases)

{
  pointer pTVar1;
  pointer pTVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  RandomNumberGenerator rng;
  RandomNumberGenerator local_11;
  
  iVar4 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])();
  if (iVar4 == 2) {
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::TestRegistry::RandomNumberGenerator&>
              ((matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (matchingTestCases->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_11);
  }
  else if (iVar4 == 1) {
    pTVar1 = (matchingTestCases->
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (matchingTestCases->
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar1 != pTVar2) {
      uVar5 = ((long)pTVar2 - (long)pTVar1 >> 3) * -0x5075075075075075;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::TestRegistry::LexSort>>
                (pTVar1,pTVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::TestRegistry::LexSort>>
                (pTVar1,pTVar2);
      return;
    }
  }
  return;
}

Assistant:

static void sortTests( IConfig const& config, std::vector<TestCase>& matchingTestCases ) {

            switch( config.runOrder() ) {
                case RunTests::InLexicographicalOrder:
                    std::sort( matchingTestCases.begin(), matchingTestCases.end(), LexSort() );
                    break;
                case RunTests::InRandomOrder:
                {
                    RandomNumberGenerator rng;
                    std::random_shuffle( matchingTestCases.begin(), matchingTestCases.end(), rng );
                }
                    break;
                case RunTests::InDeclarationOrder:
                    // already in declaration order
                    break;
            }
        }